

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_meshb_size(FILE *file,REF_INT version,REF_SIZE value)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint int_value;
  unsigned_long long_value;
  undefined4 local_c;
  REF_SIZE local_8;
  
  if (version < 4) {
    local_c = (undefined4)value;
    sVar1 = fwrite(&local_c,4,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    pcVar3 = "int value";
    uVar2 = 0x487;
  }
  else {
    local_8 = value;
    sVar1 = fwrite(&local_8,8,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    pcVar3 = "long value";
    uVar2 = 0x48a;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar2,
         "ref_gather_meshb_size",pcVar3,1,sVar1);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_meshb_size(FILE *file, REF_INT version,
                                                REF_SIZE value) {
  unsigned int int_value;
  unsigned long long_value;
  if (version < 4) {
    int_value = (unsigned int)value;
    REIS(1, fwrite(&int_value, sizeof(unsigned int), 1, file), "int value");
  } else {
    long_value = value;
    REIS(1, fwrite(&long_value, sizeof(unsigned long), 1, file), "long value");
  }
  return REF_SUCCESS;
}